

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

civil_lookup *
absl::lts_20250127::time_internal::cctz::anon_unknown_0::MakeRepeated
          (civil_lookup *__return_storage_ptr__,Transition *tr,civil_second *cs)

{
  long lVar1;
  diff_t dVar2;
  time_point<seconds> tVar3;
  civil_lookup *cl;
  civil_second *cs_local;
  Transition *tr_local;
  
  time_zone::civil_lookup::civil_lookup(__return_storage_ptr__);
  __return_storage_ptr__->kind = REPEATED;
  lVar1 = tr->unix_time;
  dVar2 = detail::operator-((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                            )(tr->prev_civil_sec).f_,
                            (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                            )cs->f_);
  tVar3 = FromUnixSeconds((lVar1 + -1) - dVar2);
  (__return_storage_ptr__->pre).__d.__r = (rep)tVar3.__d.__r;
  tVar3 = FromUnixSeconds(tr->unix_time);
  (__return_storage_ptr__->trans).__d.__r = (rep)tVar3.__d.__r;
  lVar1 = tr->unix_time;
  dVar2 = detail::operator-((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                            )cs->f_,(civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                     )(tr->civil_sec).f_);
  tVar3 = FromUnixSeconds(lVar1 + dVar2);
  (__return_storage_ptr__->post).__d.__r = (rep)tVar3.__d.__r;
  return __return_storage_ptr__;
}

Assistant:

inline time_zone::civil_lookup MakeRepeated(const Transition& tr,
                                            const civil_second& cs) {
  time_zone::civil_lookup cl;
  cl.kind = time_zone::civil_lookup::REPEATED;
  cl.pre = FromUnixSeconds(tr.unix_time - 1 - (tr.prev_civil_sec - cs));
  cl.trans = FromUnixSeconds(tr.unix_time);
  cl.post = FromUnixSeconds(tr.unix_time + (cs - tr.civil_sec));
  return cl;
}